

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_delegated(void)

{
  CTcPrsNode *pCVar1;
  CTcPrsNode *lhs;
  
  G_prs->self_referenced_ = 1;
  CTcTokenizer::next(G_tok);
  pCVar1 = parse_postfix(0,0);
  lhs = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
  lhs[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar1;
  (lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00314740;
  pCVar1 = parse_member(lhs);
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_delegated()
{
    /* 'delegated' always references 'self' */
    G_prs->set_self_referenced(TRUE);

    /* skip the "delegated" keyword */
    G_tok->next();

    /* 
     *   Parse a postfix expression giving the delegatee.  Don't allow
     *   nested member subexpressions (unless they're enclosed in
     *   parentheses, of course) - our implicit '.' postfix takes
     *   precedence.  Also, don't allow call subexpressions (unless enclosed
     *   in parens), since a postfix argument list binds to the 'delegated'
     *   expression, not to a subexpression involving a function/method
     *   call.  
     */
    CTcPrsNode *target = parse_postfix(FALSE, FALSE);

    /* set up the "delegated" node */
    CTcPrsNode *lhs = new CTPNDelegated(target);

    /* return the rest as a normal member expression */
    return parse_member(lhs);
}